

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void print_resources(Compiler *compiler,char *tag,SmallVector<spirv_cross::Resource,_8UL> *resources
                    )

{
  FILE *pFVar1;
  char cVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  StorageClass SVar6;
  StorageClass SVar7;
  uint uVar8;
  uint32_t uVar9;
  Resource *pRVar10;
  SPIRType *pSVar11;
  Bitset *pBVar12;
  SPIRType *type;
  size_t sVar13;
  size_t sVar14;
  long *plVar15;
  uint uVar16;
  long *plVar17;
  Resource *pRVar18;
  uint *puVar19;
  char cVar20;
  _Alloc_hider in_R8;
  uint *puVar21;
  uint32_t local_144;
  ulong local_130;
  size_t local_120;
  char *local_118;
  uint local_110;
  char local_108 [16];
  uint32_t counter_id;
  long local_f0;
  long local_e8;
  long lStack_e0;
  Bitset mask;
  string array;
  string local_50;
  
  fprintf(_stderr,"%s\n",tag);
  fwrite("=============\n\n",0xf,1,_stderr);
  iVar5 = strcmp(tag,"ssbos");
  sVar13 = (resources->super_VectorView<spirv_cross::Resource>).buffer_size;
  if (sVar13 != 0) {
    pRVar18 = (resources->super_VectorView<spirv_cross::Resource>).ptr;
    pRVar10 = pRVar18 + sVar13;
    do {
      pSVar11 = spirv_cross::Compiler::get_type(compiler,(TypeID)(pRVar18->type_id).id);
      if ((iVar5 != 0) ||
         (bVar3 = spirv_cross::Compiler::buffer_is_hlsl_counter_buffer
                            (compiler,(VariableID)(pRVar18->id).id), !bVar3)) {
        SVar6 = spirv_cross::Compiler::get_storage_class(compiler,(VariableID)(pRVar18->id).id);
        pBVar12 = spirv_cross::Compiler::get_decoration_bitset
                            (compiler,(ID)(pSVar11->super_IVariant).self.id);
        if (((pBVar12->lower & 4) == 0) &&
           (pBVar12 = spirv_cross::Compiler::get_decoration_bitset
                                (compiler,(ID)(pSVar11->super_IVariant).self.id),
           (pBVar12->lower & 8) == 0)) {
          local_144 = (pRVar18->id).id;
          bVar3 = false;
          local_130 = 0;
          local_120 = 0;
        }
        else {
          SVar7 = spirv_cross::Compiler::get_storage_class(compiler,(VariableID)(pRVar18->id).id);
          if (SVar7 == StorageClassUniform) {
            if (SVar6 == StorageClassPushConstant) {
              local_144 = (pRVar18->id).id;
            }
            else {
              local_144 = (pRVar18->base_type_id).id;
            }
          }
          else {
            SVar7 = spirv_cross::Compiler::get_storage_class(compiler,(VariableID)(pRVar18->id).id);
            if (SVar6 == StorageClassPushConstant) {
              local_144 = (pRVar18->id).id;
            }
            else {
              local_144 = (pRVar18->base_type_id).id;
            }
            bVar3 = false;
            local_130 = 0;
            local_120 = 0;
            if (SVar7 != StorageClassUniformConstant) goto LAB_0010b915;
          }
          type = spirv_cross::Compiler::get_type(compiler,(TypeID)(pRVar18->base_type_id).id);
          local_120 = spirv_cross::Compiler::get_declared_struct_size(compiler,type);
          sVar13 = spirv_cross::Compiler::get_declared_struct_size_runtime_array(compiler,type,1);
          sVar14 = spirv_cross::Compiler::get_declared_struct_size_runtime_array(compiler,type,0);
          local_130 = (ulong)(uint)((int)sVar13 - (int)sVar14);
          bVar3 = true;
        }
LAB_0010b915:
        mask.lower = 0;
        mask.higher._M_h._M_buckets = &mask.higher._M_h._M_single_bucket;
        mask.higher._M_h._M_bucket_count = 1;
        mask.higher._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        mask.higher._M_h._M_element_count = 0;
        mask.higher._M_h._M_rehash_policy._M_max_load_factor = 1.0;
        mask.higher._M_h._M_rehash_policy._M_next_resize = 0;
        mask.higher._M_h._M_single_bucket = (__node_base_ptr)0x0;
        if (iVar5 == 0) {
          spirv_cross::Compiler::get_buffer_block_flags
                    ((Bitset *)&array,compiler,(VariableID)(pRVar18->id).id);
          mask.lower = (uint64_t)array._M_dataplus._M_p;
          std::
          _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::_M_move_assign(&mask.higher._M_h,&array._M_string_length);
          std::
          _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                         *)&array._M_string_length);
        }
        else {
          pBVar12 = spirv_cross::Compiler::get_decoration_bitset(compiler,(ID)(pRVar18->id).id);
          mask.lower = pBVar12->lower;
          if (pBVar12 != &mask) {
            std::
            _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
            ::
            _M_assign_elements<std::_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>const&>
                      ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                        *)&mask.higher,&(pBVar12->higher)._M_h);
          }
        }
        array._M_dataplus._M_p = (pointer)&array.field_2;
        array._M_string_length = 0;
        array.field_2._M_local_buf[0] = '\0';
        sVar13 = (pSVar11->array).super_VectorView<unsigned_int>.buffer_size;
        if (sVar13 != 0) {
          puVar21 = (pSVar11->array).super_VectorView<unsigned_int>.ptr;
          puVar19 = puVar21 + sVar13;
          do {
            uVar8 = *puVar21;
            if (uVar8 == 0) {
              local_118 = local_108;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"");
            }
            else {
              cVar20 = '\x01';
              if (9 < uVar8) {
                uVar16 = uVar8;
                cVar2 = '\x04';
                do {
                  cVar20 = cVar2;
                  if (uVar16 < 100) {
                    cVar20 = cVar20 + -2;
                    goto LAB_0010ba9f;
                  }
                  if (uVar16 < 1000) {
                    cVar20 = cVar20 + -1;
                    goto LAB_0010ba9f;
                  }
                  if (uVar16 < 10000) goto LAB_0010ba9f;
                  bVar4 = 99999 < uVar16;
                  uVar16 = uVar16 / 10000;
                  cVar2 = cVar20 + '\x04';
                } while (bVar4);
                cVar20 = cVar20 + '\x01';
              }
LAB_0010ba9f:
              local_118 = local_108;
              std::__cxx11::string::_M_construct((ulong)&local_118,cVar20);
              std::__detail::__to_chars_10_impl<unsigned_int>(local_118,local_110,uVar8);
            }
            spirv_cross::join<char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
                      (&local_50,(spirv_cross *)0x2be9ba,(char (*) [2])&local_118,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2be8bf
                       ,(char (*) [2])in_R8._M_p);
            plVar15 = (long *)std::__cxx11::string::_M_append
                                        ((char *)&local_50,(ulong)array._M_dataplus._M_p);
            plVar17 = plVar15 + 2;
            if ((long *)*plVar15 == plVar17) {
              local_e8 = *plVar17;
              lStack_e0 = plVar15[3];
              _counter_id = &local_e8;
            }
            else {
              local_e8 = *plVar17;
              _counter_id = (long *)*plVar15;
            }
            local_f0 = plVar15[1];
            *plVar15 = (long)plVar17;
            plVar15[1] = 0;
            *(undefined1 *)(plVar15 + 2) = 0;
            std::__cxx11::string::operator=((string *)&array,(string *)&counter_id);
            if (_counter_id != &local_e8) {
              operator_delete(_counter_id);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p);
            }
            if (local_118 != local_108) {
              operator_delete(local_118);
            }
            puVar21 = puVar21 + 1;
          } while (puVar21 != puVar19);
        }
        pFVar1 = _stderr;
        uVar8 = (pRVar18->id).id;
        if ((pRVar18->name)._M_string_length == 0) {
          (*compiler->_vptr_Compiler[3])(&counter_id,compiler,(ulong)local_144);
          in_R8 = array._M_dataplus;
          fprintf(pFVar1," ID %03u : %s%s",(ulong)uVar8,_counter_id);
          if (_counter_id != &local_e8) {
            operator_delete(_counter_id);
          }
        }
        else {
          in_R8._M_p = array._M_dataplus._M_p;
          fprintf(_stderr," ID %03u : %s%s",(ulong)uVar8,(pRVar18->name)._M_dataplus._M_p);
        }
        pFVar1 = _stderr;
        if (((uint)mask.lower >> 0x1e & 1) != 0) {
          uVar9 = spirv_cross::Compiler::get_decoration
                            (compiler,(ID)(pRVar18->id).id,DecorationLocation);
          fprintf(pFVar1," (Location : %u)",(ulong)uVar9);
        }
        pFVar1 = _stderr;
        if ((mask.lower >> 0x22 & 1) != 0) {
          uVar9 = spirv_cross::Compiler::get_decoration
                            (compiler,(ID)(pRVar18->id).id,DecorationDescriptorSet);
          fprintf(pFVar1," (Set : %u)",(ulong)uVar9);
        }
        pFVar1 = _stderr;
        if ((mask.lower >> 0x21 & 1) != 0) {
          uVar9 = spirv_cross::Compiler::get_decoration
                            (compiler,(ID)(pRVar18->id).id,DecorationBinding);
          fprintf(pFVar1," (Binding : %u)",(ulong)uVar9);
        }
        bVar4 = spirv_cross::CompilerGLSL::variable_is_depth_or_compare
                          ((CompilerGLSL *)compiler,(VariableID)(pRVar18->id).id);
        if (bVar4) {
          fwrite(" (comparison)",0xd,1,_stderr);
        }
        pFVar1 = _stderr;
        if ((mask.lower >> 0x2b & 1) != 0) {
          uVar9 = spirv_cross::Compiler::get_decoration
                            (compiler,(ID)(pRVar18->id).id,DecorationInputAttachmentIndex);
          fprintf(pFVar1," (Attachment : %u)",(ulong)uVar9);
        }
        uVar8 = (uint)mask.lower;
        if ((uVar8 >> 0x19 & 1) != 0) {
          fwrite(" writeonly",10,1,_stderr);
          uVar8 = (uint)mask.lower;
        }
        if ((uVar8 >> 0x18 & 1) != 0) {
          fwrite(" readonly",9,1,_stderr);
          uVar8 = (uint)mask.lower;
        }
        if ((uVar8 >> 0x13 & 1) != 0) {
          fwrite(" restrict",9,1,_stderr);
          uVar8 = (uint)mask.lower;
        }
        if ((uVar8 >> 0x17 & 1) != 0) {
          fwrite(" coherent",9,1,_stderr);
          uVar8 = (uint)mask.lower;
        }
        if ((uVar8 >> 0x15 & 1) != 0) {
          fwrite(" volatile",9,1,_stderr);
        }
        if (bVar3) {
          fprintf(_stderr," (BlockSize : %u bytes)",local_120);
          if ((int)local_130 != 0) {
            fprintf(_stderr," (Unsized array stride: %u bytes)",local_130);
          }
        }
        _counter_id = (long *)((ulong)_counter_id & 0xffffffff00000000);
        if ((iVar5 == 0) &&
           (bVar3 = spirv_cross::Compiler::buffer_get_hlsl_counter_buffer
                              (compiler,(VariableID)(pRVar18->id).id,&counter_id), bVar3)) {
          fprintf(_stderr," (HLSL counter buffer ID: %u)",(ulong)_counter_id & 0xffffffff);
        }
        fputc(10,_stderr);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)array._M_dataplus._M_p != &array.field_2) {
          operator_delete(array._M_dataplus._M_p);
        }
        std::
        _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::~_Hashtable(&mask.higher._M_h);
      }
      pRVar18 = pRVar18 + 1;
    } while (pRVar18 != pRVar10);
  }
  fwrite("=============\n\n",0xf,1,_stderr);
  return;
}

Assistant:

static void print_resources(const Compiler &compiler, const char *tag, const SmallVector<Resource> &resources)
{
	fprintf(stderr, "%s\n", tag);
	fprintf(stderr, "=============\n\n");
	bool print_ssbo = !strcmp(tag, "ssbos");

	for (auto &res : resources)
	{
		auto &type = compiler.get_type(res.type_id);

		if (print_ssbo && compiler.buffer_is_hlsl_counter_buffer(res.id))
			continue;

		// If we don't have a name, use the fallback for the type instead of the variable
		// for SSBOs and UBOs since those are the only meaningful names to use externally.
		// Push constant blocks are still accessed by name and not block name, even though they are technically Blocks.
		bool is_push_constant = compiler.get_storage_class(res.id) == StorageClassPushConstant;
		bool is_block = compiler.get_decoration_bitset(type.self).get(DecorationBlock) ||
		                compiler.get_decoration_bitset(type.self).get(DecorationBufferBlock);
		bool is_sized_block = is_block && (compiler.get_storage_class(res.id) == StorageClassUniform ||
		                                   compiler.get_storage_class(res.id) == StorageClassUniformConstant);
		ID fallback_id = !is_push_constant && is_block ? ID(res.base_type_id) : ID(res.id);

		uint32_t block_size = 0;
		uint32_t runtime_array_stride = 0;
		if (is_sized_block)
		{
			auto &base_type = compiler.get_type(res.base_type_id);
			block_size = uint32_t(compiler.get_declared_struct_size(base_type));
			runtime_array_stride = uint32_t(compiler.get_declared_struct_size_runtime_array(base_type, 1) -
			                                compiler.get_declared_struct_size_runtime_array(base_type, 0));
		}

		Bitset mask;
		if (print_ssbo)
			mask = compiler.get_buffer_block_flags(res.id);
		else
			mask = compiler.get_decoration_bitset(res.id);

		string array;
		for (auto arr : type.array)
			array = join("[", arr ? convert_to_string(arr) : "", "]") + array;

		fprintf(stderr, " ID %03u : %s%s", uint32_t(res.id),
		        !res.name.empty() ? res.name.c_str() : compiler.get_fallback_name(fallback_id).c_str(), array.c_str());

		if (mask.get(DecorationLocation))
			fprintf(stderr, " (Location : %u)", compiler.get_decoration(res.id, DecorationLocation));
		if (mask.get(DecorationDescriptorSet))
			fprintf(stderr, " (Set : %u)", compiler.get_decoration(res.id, DecorationDescriptorSet));
		if (mask.get(DecorationBinding))
			fprintf(stderr, " (Binding : %u)", compiler.get_decoration(res.id, DecorationBinding));
		if (static_cast<const CompilerGLSL &>(compiler).variable_is_depth_or_compare(res.id))
			fprintf(stderr, " (comparison)");
		if (mask.get(DecorationInputAttachmentIndex))
			fprintf(stderr, " (Attachment : %u)", compiler.get_decoration(res.id, DecorationInputAttachmentIndex));
		if (mask.get(DecorationNonReadable))
			fprintf(stderr, " writeonly");
		if (mask.get(DecorationNonWritable))
			fprintf(stderr, " readonly");
		if (mask.get(DecorationRestrict))
			fprintf(stderr, " restrict");
		if (mask.get(DecorationCoherent))
			fprintf(stderr, " coherent");
		if (mask.get(DecorationVolatile))
			fprintf(stderr, " volatile");
		if (is_sized_block)
		{
			fprintf(stderr, " (BlockSize : %u bytes)", block_size);
			if (runtime_array_stride)
				fprintf(stderr, " (Unsized array stride: %u bytes)", runtime_array_stride);
		}

		uint32_t counter_id = 0;
		if (print_ssbo && compiler.buffer_get_hlsl_counter_buffer(res.id, counter_id))
			fprintf(stderr, " (HLSL counter buffer ID: %u)", counter_id);
		fprintf(stderr, "\n");
	}
	fprintf(stderr, "=============\n\n");
}